

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

size_t __thiscall Memory::RecyclerHeapObjectInfo::GetSize(RecyclerHeapObjectInfo *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ulong local_18;
  size_t size;
  RecyclerHeapObjectInfo *this_local;
  
  if (this->m_heapBlock == (HeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2456,"(m_heapBlock)","m_heapBlock");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if ((this->isUsingLargeHeapBlock & 1U) == 0) {
    uVar3 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetObjectSize
                      ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this->m_heapBlock);
    local_18 = (ulong)uVar3;
  }
  else {
    local_18 = ((this->field_3).m_largeHeapBlockHeader)->objectSize;
  }
  BVar4 = Recycler::VerifyEnabled(this->m_recycler);
  if (BVar4 != 0) {
    local_18 = local_18 - *(long *)((long)this->m_address + (local_18 - 8));
  }
  return local_18;
}

Assistant:

size_t
RecyclerHeapObjectInfo::GetSize() const
{
    Assert(m_heapBlock);

    size_t size;
#if LARGEHEAPBLOCK_ENCODING
    if (isUsingLargeHeapBlock)
    {
        size = m_largeHeapBlockHeader->objectSize;
    }
#else
    if (m_heapBlock->IsLargeHeapBlock())
    {
        size = ((LargeHeapBlock*)m_heapBlock)->GetObjectSize(m_address);
    }
#endif
    else
    {
        // All small heap block types have the same layout for the object size field.
        size = ((SmallHeapBlock*)m_heapBlock)->GetObjectSize();
    }